

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_449da5::HandleChmodCommandImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool recurse,cmExecutionStatus *status)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  uint *puVar7;
  string *inName;
  undefined8 filename;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  mode_t perms;
  mode_t dperms;
  mode_t fperms;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tempPathEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathEntries;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Arguments parsedArgs;
  Glob globber;
  mode_t local_1f4 [3];
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  pointer local_1b8;
  undefined1 local_1a8 [16];
  pointer local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [56];
  _Any_data _Stack_140;
  _Manager_type p_Stack_130;
  bool local_128;
  undefined1 local_118 [16];
  pointer local_108;
  _Any_data _Stack_100;
  _Manager_type p_Stack_f0;
  undefined1 local_e8 [24];
  _Manager_type p_Stack_d0;
  _Storage<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  local_c8;
  pointer ppStack_b0;
  optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a8;
  Glob local_88;
  
  local_1f4[0] = 0;
  local_1f4[2] = 0;
  local_1f4[1] = 0;
  cmsys::Glob::Glob(&local_88);
  local_88.Recurse = recurse;
  local_88.RecurseListDirs = recurse;
  if ((anonymous_namespace)::
      HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)
      ::parser == '\0') {
    iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)
                                 ::parser);
    if (iVar5 != 0) {
      local_c8._M_value.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppStack_b0 = (pointer)0x0;
      local_c8._M_value.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8._M_value.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8._16_8_ = (pointer)0x0;
      p_Stack_d0 = (_Manager_type)0x0;
      local_e8._0_8_ = (pointer)0x0;
      local_e8._8_8_ = (pointer)0x0;
      _Stack_100._8_8_ = (_Base_ptr)0x0;
      p_Stack_f0 = (_Manager_type)0x0;
      local_108 = (pointer)0x0;
      _Stack_100._M_unused._M_object = (_Base_ptr)0x0;
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (pointer)0x0;
      name.super_string_view._M_str = "PERMISSIONS";
      name.super_string_view._M_len = 0xb;
      cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
      ::
      Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
                  *)local_118,name,0x30);
      name_00.super_string_view._M_str = "FILE_PERMISSIONS";
      name_00.super_string_view._M_len = 0x10;
      cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
      ::
      Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
                  *)local_118,name_00,0x50);
      name_01.super_string_view._M_str = "DIRECTORY_PERMISSIONS";
      name_01.super_string_view._M_len = 0x15;
      cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
      ::
      Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
                  *)local_118,name_01,0x70);
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&HandleChmodCommandImpl::parser,(ActionMap *)local_118);
      ArgumentParser::Base::~Base((Base *)local_118);
      __cxa_atexit(ArgumentParser::Base::~Base,&HandleChmodCommandImpl::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)
                           ::parser);
    }
  }
  local_178._0_8_ = local_1a8;
  local_1a8._0_8_ = (string *)0x0;
  local_1a8._8_8_ = (string *)0x0;
  local_198 = (pointer)0x0;
  local_1e8._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_1e8._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  _Stack_100._M_unused._0_8_ = (undefined8)(local_118 + 8);
  local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
  local_108 = (pointer)0x0;
  p_Stack_f0 = (_Manager_type)0x0;
  p_Stack_d0 = (_Manager_type)((ulong)p_Stack_d0 & 0xffffffffffffff00);
  ppStack_b0 = (pointer)((ulong)ppStack_b0 & 0xffffffffffffff00);
  local_a8.
  super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_engaged = false;
  local_188._0_8_ = &HandleChmodCommandImpl::parser;
  local_188._8_8_ = local_118;
  local_178._16_8_ = (pointer)0x0;
  local_178._24_8_ = (char *)0x0;
  local_178._32_8_ = 0;
  local_178._40_8_ = (_Manager_type)0x0;
  local_178._48_8_ = (void *)0x0;
  _Stack_140._0_8_ = 0;
  _Stack_140._8_8_ = (_Manager_type)0x0;
  p_Stack_130 = (_Manager_type)0x0;
  local_128 = false;
  local_178._8_8_ = local_188._8_8_;
  _Stack_100._8_8_ = _Stack_100._M_unused._M_object;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_188,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_1e8,0);
  if ((_Manager_type)_Stack_140._8_8_ != (_Manager_type)0x0) {
    (*(code *)_Stack_140._8_8_)(local_178 + 0x30,local_178 + 0x30,3);
  }
  if (p_Stack_d0._0_1_ == false) {
    if (((char)ppStack_b0 != '\0') ||
       (local_a8.
        super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_engaged != false)) goto LAB_001dc2b1;
    local_188._0_8_ = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"No permissions given","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001dc469:
    if ((ActionMap *)local_188._0_8_ != (ActionMap *)local_178) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
    }
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  else {
    if (((char)ppStack_b0 != '\0') &&
       (local_a8.
        super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_engaged == true)) {
      local_188._0_8_ = local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_188,
                 "Remove either PERMISSIONS or FILE_PERMISSIONS or DIRECTORY_PERMISSIONS from the invocation"
                 ,"");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001dc469;
    }
LAB_001dc2b1:
    bVar3 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_118,status->Makefile)
    ;
    if (bVar3) {
      cmSystemTools::s_FatalErrorOccurred = true;
      bVar3 = true;
      goto LAB_001dc48f;
    }
    bVar3 = ValidateAndConvertPermissions
                      ((optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_e8,local_1f4,status);
    if (bVar3) {
      bVar3 = ValidateAndConvertPermissions
                        ((optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&local_c8._M_value,local_1f4 + 2,status);
      if (bVar3) {
        bVar3 = ValidateAndConvertPermissions(&local_a8,local_1f4 + 1,status);
        uVar2 = local_1a8._8_8_;
        if (bVar3) {
          local_1c8._M_allocated_capacity = 0;
          local_1c8._8_8_ = (string *)0x0;
          local_1b8 = (pointer)0x0;
          if (recurse) {
            local_1e8._0_8_ = (pointer)0x0;
            local_1e8._8_8_ = (pointer)0x0;
            local_1e8._16_8_ = (pointer)0x0;
            if (local_1a8._0_8_ != local_1a8._8_8_) {
              inName = (string *)local_1a8._0_8_;
              do {
                bVar3 = cmsys::SystemTools::FileIsDirectory(inName);
                if (bVar3) {
                  local_188._0_8_ = local_178;
                  pcVar1 = (inName->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_188,pcVar1,pcVar1 + inName->_M_string_length);
                  std::__cxx11::string::append((char *)local_188);
                  cmsys::Glob::FindFiles(&local_88,(string *)local_188,(GlobMessages *)0x0);
                  if ((ActionMap *)local_188._0_8_ != (ActionMap *)local_178) {
                    operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
                  }
                  pvVar6 = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1e8,pvVar6);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_1c8,local_1c8._8_8_,local_1e8._0_8_,local_1e8._8_8_);
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string_const&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_1c8._M_local_buf,inName);
                inName = inName + 1;
              } while (inName != (string *)uVar2);
            }
            pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1e8;
          }
          else {
            local_1c8._M_allocated_capacity = local_1a8._0_8_;
            local_1c8._8_8_ = local_1a8._8_8_;
            local_1b8 = local_198;
            pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_188;
            local_188._0_8_ = (ActionMap *)0x0;
            local_188._8_8_ = (pointer)0x0;
            local_178._0_8_ = (pointer)0x0;
            local_1a8._0_8_ = (string *)0x0;
            local_1a8._8_8_ = (string *)0x0;
            local_198 = (pointer)0x0;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(pvVar6);
          uVar2 = local_1c8._8_8_;
          bVar3 = true;
          for (filename = local_1c8._M_allocated_capacity; filename != uVar2;
              filename = filename + 0x20) {
            bVar4 = cmsys::SystemTools::FileExists((string *)filename);
            if (!bVar4) {
              bVar4 = cmsys::SystemTools::FileIsDirectory((string *)filename);
              if (bVar4) goto LAB_001dc576;
              local_178._8_8_ = (((string *)filename)->_M_dataplus)._M_p;
              local_178._0_8_ = ((string *)filename)->_M_string_length;
              local_188._0_8_ = (ActionMap *)0x12;
              local_188._8_8_ = "does not exist:\n  ";
              views._M_len = 2;
              views._M_array = (iterator)local_188;
              cmCatViews_abi_cxx11_((string *)local_1e8,views);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
              }
              cmSystemTools::s_FatalErrorOccurred = true;
LAB_001dc65d:
              bVar3 = false;
              break;
            }
LAB_001dc576:
            bVar4 = cmsys::SystemTools::FileExists((string *)filename,true);
            if (bVar4) {
              puVar7 = local_1f4;
              if ((char)ppStack_b0 != '\0') {
                puVar7 = local_1f4 + 2;
              }
              if (*puVar7 != 0) {
                bVar4 = SetPermissions((string *)filename,(mode_t *)(ulong)*puVar7,status);
LAB_001dc5e3:
                if (bVar4 == false) goto LAB_001dc65d;
              }
            }
            else {
              bVar4 = cmsys::SystemTools::FileIsDirectory((string *)filename);
              if (bVar4) {
                puVar7 = local_1f4;
                if (local_a8.
                    super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_engaged != false) {
                  puVar7 = local_1f4 + 1;
                }
                if (*puVar7 != 0) {
                  bVar4 = SetPermissions((string *)filename,(mode_t *)(ulong)*puVar7,status);
                  goto LAB_001dc5e3;
                }
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1c8);
          goto LAB_001dc48f;
        }
      }
    }
  }
  bVar3 = false;
LAB_001dc48f:
  if (local_a8.
      super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    local_a8.
    super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_engaged = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
  }
  if ((char)ppStack_b0 == '\x01') {
    ppStack_b0 = (pointer)((ulong)ppStack_b0 & 0xffffffffffffff00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8._M_value.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  if (p_Stack_d0._0_1_ == true) {
    p_Stack_d0 = (_Manager_type)((ulong)p_Stack_d0 & 0xffffffffffffff00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1a8);
  cmsys::Glob::~Glob(&local_88);
  return bVar3;
}

Assistant:

bool HandleChmodCommandImpl(std::vector<std::string> const& args, bool recurse,
                            cmExecutionStatus& status)
{
  mode_t perms = 0;
  mode_t fperms = 0;
  mode_t dperms = 0;
  cmsys::Glob globber;

  globber.SetRecurse(recurse);
  globber.SetRecurseListDirs(recurse);

  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>>
      Permissions;
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>>
      FilePermissions;
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>>
      DirectoryPermissions;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("PERMISSIONS"_s, &Arguments::Permissions)
      .Bind("FILE_PERMISSIONS"_s, &Arguments::FilePermissions)
      .Bind("DIRECTORY_PERMISSIONS"_s, &Arguments::DirectoryPermissions);

  std::vector<std::string> pathEntries;
  Arguments parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &pathEntries);

  // check validity of arguments
  if (!parsedArgs.Permissions && !parsedArgs.FilePermissions &&
      !parsedArgs.DirectoryPermissions) // no permissions given
  {
    status.SetError("No permissions given");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.Permissions && parsedArgs.FilePermissions &&
      parsedArgs.DirectoryPermissions) // all keywords are used
  {
    status.SetError("Remove either PERMISSIONS or FILE_PERMISSIONS or "
                    "DIRECTORY_PERMISSIONS from the invocation");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  // validate permissions
  bool validatePermissions =
    ValidateAndConvertPermissions(parsedArgs.Permissions, perms, status) &&
    ValidateAndConvertPermissions(parsedArgs.FilePermissions, fperms,
                                  status) &&
    ValidateAndConvertPermissions(parsedArgs.DirectoryPermissions, dperms,
                                  status);
  if (!validatePermissions) {
    return false;
  }

  std::vector<std::string> allPathEntries;

  if (recurse) {
    std::vector<std::string> tempPathEntries;
    for (const auto& i : pathEntries) {
      if (cmSystemTools::FileIsDirectory(i)) {
        globber.FindFiles(i + "/*");
        tempPathEntries = globber.GetFiles();
        allPathEntries.insert(allPathEntries.end(), tempPathEntries.begin(),
                              tempPathEntries.end());
        allPathEntries.emplace_back(i);
      } else {
        allPathEntries.emplace_back(i); // We validate path entries below
      }
    }
  } else {
    allPathEntries = std::move(pathEntries);
  }

  // chmod
  for (const auto& i : allPathEntries) {
    if (!(cmSystemTools::FileExists(i) || cmSystemTools::FileIsDirectory(i))) {
      status.SetError(cmStrCat("does not exist:\n  ", i));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }

    if (cmSystemTools::FileExists(i, true)) {
      bool success = true;
      const mode_t& filePermissions =
        parsedArgs.FilePermissions ? fperms : perms;
      if (filePermissions) {
        success = SetPermissions(i, filePermissions, status);
      }
      if (!success) {
        return false;
      }
    }

    else if (cmSystemTools::FileIsDirectory(i)) {
      bool success = true;
      const mode_t& directoryPermissions =
        parsedArgs.DirectoryPermissions ? dperms : perms;
      if (directoryPermissions) {
        success = SetPermissions(i, directoryPermissions, status);
      }
      if (!success) {
        return false;
      }
    }
  }

  return true;
}